

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileLED.cpp
# Opt level: O2

void __thiscall TileLED::followWire(TileLED *this,Direction direction,State state)

{
  TileLED *local_8;
  
  local_8 = this;
  std::vector<TileLED*,std::allocator<TileLED*>>::emplace_back<TileLED*>
            ((vector<TileLED*,std::allocator<TileLED*>> *)&Board::endpointLEDs,&local_8);
  return;
}

Assistant:

void TileLED::followWire(Direction direction, State state) {
    Board::endpointLEDs.push_back(this);
}